

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

int assert_f32_eq(float a,float b,char *testcase,int line)

{
  test_counter = test_counter + 1;
  if ((a != b) || (NAN(a) || NAN(b))) {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
    printf("# Expected %f, but observed %f instead (line %d)\n",SUB84((double)a,0),(double)b,line);
    global_err = global_err + 1;
  }
  else {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
  }
  return -(uint)(a != b) & 1;
}

Assistant:

int assert_f32_eq(float a, float b,const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %f, but observed %f instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}